

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFJob_json.cc
# Opt level: O2

void __thiscall
anon_unknown.dwarf_3a3c9b::Handlers::addParameter(Handlers *this,param_handler_t *fn)

{
  JSONHandler *this_00;
  _Any_data local_48;
  code *local_38;
  code *pcStack_30;
  _Any_data local_28;
  long local_18;
  undefined8 uStack_10;
  
  this_00 = this->jh;
  std::function<void_(const_char_*)>::function((function<void_(const_char_*)> *)&local_28,fn);
  local_38 = (code *)0x0;
  pcStack_30 = (code *)0x0;
  local_48._M_unused._M_object = (void *)0x0;
  local_48._8_8_ = 0;
  local_48._M_unused._M_object = operator_new(0x20);
  *(undefined8 *)local_48._M_unused._0_8_ = 0;
  *(undefined8 *)((long)local_48._M_unused._0_8_ + 8) = 0;
  *(undefined8 *)((long)local_48._M_unused._0_8_ + 0x10) = 0;
  *(undefined8 *)((long)local_48._M_unused._0_8_ + 0x18) = uStack_10;
  if (local_18 != 0) {
    *(void **)local_48._M_unused._0_8_ = local_28._M_unused._M_object;
    *(undefined8 *)((long)local_48._M_unused._0_8_ + 8) = local_28._8_8_;
    *(long *)((long)local_48._M_unused._0_8_ + 0x10) = local_18;
    local_18 = 0;
    uStack_10 = 0;
  }
  pcStack_30 = std::
               _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libqpdf/QPDFJob_json.cc:141:9)>
               ::_M_invoke;
  local_38 = std::
             _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libqpdf/QPDFJob_json.cc:141:9)>
             ::_M_manager;
  JSONHandler::addStringHandler(this_00,(string_handler_t *)&local_48);
  std::_Function_base::~_Function_base((_Function_base *)&local_48);
  std::_Function_base::~_Function_base((_Function_base *)&local_28);
  return;
}

Assistant:

void
Handlers::addParameter(param_handler_t fn)
{
    jh->addStringHandler(
        [fn](std::string const& path, std::string const& parameter) { fn(parameter.c_str()); });
}